

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle_private.hh
# Opt level: O0

Stream __thiscall QPDFObjectHandle::as_stream(QPDFObjectHandle *this,typed options)

{
  qpdf_object_type_e qVar1;
  byte in_DL;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined7 in_register_00000031;
  BaseHandle *this_00;
  Stream SVar3;
  shared_ptr<QPDFObject> local_30;
  byte local_19;
  BaseHandle *pBStack_18;
  typed options_local;
  QPDFObjectHandle *this_local;
  
  this_00 = (BaseHandle *)CONCAT71(in_register_00000031,options);
  pBStack_18 = this_00;
  this_local = this;
  if ((in_DL & 1) == 0) {
    local_19 = in_DL;
    qVar1 = ::qpdf::BaseHandle::type_code(this_00);
    if (qVar1 != ot_stream) {
      if ((local_19 & 2) != 0) {
        qVar1 = ::qpdf::BaseHandle::type_code(this_00);
        if (qVar1 == ot_null) goto LAB_00165dfc;
      }
      if ((local_19 & 4) != 0) {
        assertType((QPDFObjectHandle *)this_00,"stream",false);
      }
      std::shared_ptr<QPDFObject>::shared_ptr(&local_30);
      ::qpdf::Stream::Stream((Stream *)this,&local_30);
      std::shared_ptr<QPDFObject>::~shared_ptr(&local_30);
      _Var2._M_pi = extraout_RDX_00;
      goto LAB_00165e67;
    }
  }
LAB_00165dfc:
  ::qpdf::Stream::Stream((Stream *)this,(shared_ptr<QPDFObject> *)this_00);
  _Var2._M_pi = extraout_RDX;
LAB_00165e67:
  SVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  SVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Stream)SVar3.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline qpdf::Stream
QPDFObjectHandle::as_stream(qpdf::typed options) const
{
    if (options & qpdf::any_flag || type_code() == ::ot_stream ||
        (options & qpdf::optional && type_code() == ::ot_null)) {
        return qpdf::Stream(obj);
    }
    if (options & qpdf::error) {
        assertType("stream", false);
    }
    return qpdf::Stream(std::shared_ptr<QPDFObject>());
}